

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

int Cba_ManWriteLineFile(Cba_Ntk_t *p,int iObj,int FileAttr,int LineAttr)

{
  Cba_Man_t *pCVar1;
  int NameId;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = 0;
  if (FileAttr != 0) {
    pCVar1 = p->pDesign;
    NameId = Cba_ObjAttrValue(p,iObj,FileAttr);
    iVar4 = 0;
    if (NameId != 0) {
      uVar2 = Cba_ObjAttrValue(p,iObj,LineAttr);
      pcVar3 = Abc_NamStr(p->pDesign->pStrs,NameId);
      Vec_StrPrintF(&pCVar1->vOut,"  // %s(%d)",pcVar3,(ulong)uVar2);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int Cba_ManWriteLineFile( Cba_Ntk_t * p, int iObj, int FileAttr, int LineAttr )
{
    Vec_Str_t * vStr = &p->pDesign->vOut;
    int FileId = 0, LineId = 0;
    if ( FileAttr && (FileId = Cba_ObjAttrValue(p, iObj, FileAttr)) )
    {
        LineId = Cba_ObjAttrValue(p, iObj, LineAttr);
        Vec_StrPrintF( vStr, "  // %s(%d)", Cba_NtkStr(p, FileId), LineId );
        return 1;
    }
    return 0;
}